

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void wasm::ABI::getStackSpace(Index local,Function *func,Index size,Module *wasm)

{
  Function *func_00;
  bool bVar1;
  Index IVar2;
  reference this;
  pointer pMVar3;
  ExpressionList *pEVar4;
  GlobalGet *value;
  LocalSet *pLVar5;
  LocalGet *pLVar6;
  Const *right;
  GlobalSet *pGVar7;
  reference pppEVar8;
  Return *item;
  Block *pBVar9;
  Type TVar10;
  bool local_2f1;
  BasicType local_2b0;
  Index temp_1;
  uintptr_t local_2a8;
  uintptr_t local_2a0;
  Index local_294;
  Block *pBStack_290;
  Index temp;
  Block *block_1;
  Return *local_280;
  Return *ret;
  Expression **ptr;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *__range2;
  FindAllPointers<wasm::Return> finder;
  anon_class_32_4_3ed16325 makeStackRestore;
  BasicType local_204;
  Binary *local_200;
  Expression *added;
  size_t local_1f0;
  char *local_1e8;
  Block *local_1e0;
  Block *block;
  Builder builder;
  Type pointerType;
  Fatal local_1b8;
  Global *local_30;
  Global *stackPointer;
  Module *wasm_local;
  Function *pFStack_18;
  Index size_local;
  Function *func_local;
  Index local_local;
  
  stackPointer = (Global *)wasm;
  wasm_local._4_4_ = size;
  pFStack_18 = func;
  func_local._4_4_ = local;
  local_30 = getStackPointerGlobal(wasm);
  if (local_30 == (Global *)0x0) {
    Fatal::Fatal(&local_1b8);
    Fatal::operator<<(&local_1b8,(char (*) [48])"getStackSpace: failed to find the stack pointer");
    Fatal::~Fatal(&local_1b8);
  }
  wasm_local._4_4_ = stackAlign(wasm_local._4_4_);
  bVar1 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   *)&stackPointer[1].super_Importable.base);
  if (bVar1) {
    wasm::Type::Type((Type *)&builder,i32);
  }
  else {
    this = std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                         *)&stackPointer[1].super_Importable.base,0);
    pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this);
    builder.wasm = (Module *)(pMVar3->indexType).id;
  }
  Builder::Builder((Builder *)&block,(Module *)stackPointer);
  local_1e0 = Builder::makeBlock((Builder *)&block,(Expression *)0x0);
  IVar2 = func_local._4_4_;
  pEVar4 = &local_1e0->list;
  local_1f0 = (local_30->super_Importable).super_Named.name.super_IString.str._M_len;
  local_1e8 = (local_30->super_Importable).super_Named.name.super_IString.str._M_str;
  added = (Expression *)builder.wasm;
  value = Builder::makeGlobalGet
                    ((Builder *)&block,
                     (Name)(local_30->super_Importable).super_Named.name.super_IString.str,
                     (Type)builder.wasm);
  pLVar5 = Builder::makeLocalSet((Builder *)&block,IVar2,(Expression *)value);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&pEVar4->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pLVar5);
  local_204 = i32;
  bVar1 = wasm::Type::operator==((Type *)&builder,&local_204);
  if (bVar1) {
    pLVar6 = Builder::makeLocalGet((Builder *)&block,func_local._4_4_,(Type)builder.wasm);
    right = Builder::makeConst<int>((Builder *)&block,wasm_local._4_4_);
    local_200 = Builder::makeBinary((Builder *)&block,SubInt32,(Expression *)pLVar6,
                                    (Expression *)right);
    pEVar4 = &local_1e0->list;
    pGVar7 = Builder::makeGlobalSet
                       ((Builder *)&block,
                        (Name)(local_30->super_Importable).super_Named.name.super_IString.str,
                        (Expression *)local_200);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar4->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pGVar7);
    finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&block;
    FindAllPointers<wasm::Return>::FindAllPointers
              ((FindAllPointers<wasm::Return> *)&__range2,&pFStack_18->body);
    __end2 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::begin
                       ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                        &__range2);
    ptr = (Expression **)
          std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end
                    ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)&__range2)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                                       *)&ptr), bVar1) {
      pppEVar8 = __gnu_cxx::
                 __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                 ::operator*(&__end2);
      ret = (Return *)*pppEVar8;
      local_280 = Expression::cast<wasm::Return>
                            (*(Expression **)
                              &(ret->super_SpecificExpression<(wasm::Expression::Id)19>).
                               super_Expression);
      local_2f1 = false;
      if (local_280->value != (Expression *)0x0) {
        block_1._4_4_ = 1;
        local_2f1 = wasm::Type::operator!=
                              (&local_280->value->type,(BasicType *)((long)&block_1 + 4));
      }
      if (local_2f1 == false) {
        pGVar7 = getStackSpace::anon_class_32_4_3ed16325::operator()
                           ((anon_class_32_4_3ed16325 *)
                            &finder.list.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pBVar9 = Builder::makeSequence
                           ((Builder *)&block,(Expression *)pGVar7,(Expression *)local_280);
        *(Block **)&(ret->super_SpecificExpression<(wasm::Expression::Id)19>).super_Expression =
             pBVar9;
      }
      else {
        pBStack_290 = Builder::makeBlock((Builder *)&block,(Expression *)0x0);
        local_2a0 = (local_280->value->type).id;
        local_294 = Builder::addVar(pFStack_18,(Type)local_2a0);
        pEVar4 = &pBStack_290->list;
        pLVar5 = Builder::makeLocalSet((Builder *)&block,local_294,local_280->value);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar4->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pLVar5);
        pEVar4 = &pBStack_290->list;
        pGVar7 = getStackSpace::anon_class_32_4_3ed16325::operator()
                           ((anon_class_32_4_3ed16325 *)
                            &finder.list.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar4->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pGVar7);
        pEVar4 = &pBStack_290->list;
        local_2a8 = (local_280->value->type).id;
        pLVar6 = Builder::makeLocalGet((Builder *)&block,local_294,(Type)local_2a8);
        item = Builder::makeReturn((Builder *)&block,(Expression *)pLVar6);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar4->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)item);
        Block::finalize(pBStack_290);
        *(Block **)&(ret->super_SpecificExpression<(wasm::Expression::Id)19>).super_Expression =
             pBStack_290;
      }
      __gnu_cxx::
      __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
      ::operator++(&__end2);
    }
    temp_1 = 0;
    bVar1 = wasm::Type::operator==(&pFStack_18->body->type,&temp_1);
    if (bVar1) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(local_1e0->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 pFStack_18->body);
      pEVar4 = &local_1e0->list;
      pGVar7 = getStackSpace::anon_class_32_4_3ed16325::operator()
                         ((anon_class_32_4_3ed16325 *)
                          &finder.list.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar4->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,(Expression *)pGVar7);
    }
    else {
      local_2b0 = unreachable;
      bVar1 = wasm::Type::operator==(&pFStack_18->body->type,&local_2b0);
      func_00 = pFStack_18;
      if (bVar1) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(local_1e0->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pFStack_18->body);
      }
      else {
        TVar10 = Function::getResults(pFStack_18);
        IVar2 = Builder::addVar(func_00,TVar10);
        pEVar4 = &local_1e0->list;
        pLVar5 = Builder::makeLocalSet((Builder *)&block,IVar2,pFStack_18->body);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar4->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pLVar5);
        pEVar4 = &local_1e0->list;
        pGVar7 = getStackSpace::anon_class_32_4_3ed16325::operator()
                           ((anon_class_32_4_3ed16325 *)
                            &finder.list.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar4->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pGVar7);
        pEVar4 = &local_1e0->list;
        TVar10 = Function::getResults(pFStack_18);
        pLVar6 = Builder::makeLocalGet((Builder *)&block,IVar2,TVar10);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar4->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pLVar6);
      }
    }
    Block::finalize(local_1e0);
    pFStack_18->body = (Expression *)local_1e0;
    FindAllPointers<wasm::Return>::~FindAllPointers((FindAllPointers<wasm::Return> *)&__range2);
    return;
  }
  handle_unreachable("unhandled pointerType",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/abi/stack.h"
                     ,0x44);
}

Assistant:

inline void
getStackSpace(Index local, Function* func, Index size, Module& wasm) {
  auto* stackPointer = getStackPointerGlobal(wasm);
  if (!stackPointer) {
    Fatal() << "getStackSpace: failed to find the stack pointer";
  }
  // align the size
  size = stackAlign(size);
  auto pointerType =
    !wasm.memories.empty() ? wasm.memories[0]->indexType : Type::i32;
  // TODO: find existing stack usage, and add on top of that - carefully
  Builder builder(wasm);
  auto* block = builder.makeBlock();
  block->list.push_back(builder.makeLocalSet(
    local, builder.makeGlobalGet(stackPointer->name, pointerType)));
  // TODO: add stack max check
  Expression* added;
  if (pointerType == Type::i32) {
    // The stack goes downward in the LLVM wasm backend.
    added = builder.makeBinary(SubInt32,
                               builder.makeLocalGet(local, pointerType),
                               builder.makeConst(int32_t(size)));
  } else {
    WASM_UNREACHABLE("unhandled pointerType");
  }
  block->list.push_back(builder.makeGlobalSet(stackPointer->name, added));
  auto makeStackRestore = [&]() {
    return builder.makeGlobalSet(stackPointer->name,
                                 builder.makeLocalGet(local, pointerType));
  };
  // add stack restores to the returns
  FindAllPointers<Return> finder(func->body);
  for (auto** ptr : finder.list) {
    auto* ret = (*ptr)->cast<Return>();
    if (ret->value && ret->value->type != Type::unreachable) {
      // handle the returned value
      auto* block = builder.makeBlock();
      auto temp = builder.addVar(func, ret->value->type);
      block->list.push_back(builder.makeLocalSet(temp, ret->value));
      block->list.push_back(makeStackRestore());
      block->list.push_back(
        builder.makeReturn(builder.makeLocalGet(temp, ret->value->type)));
      block->finalize();
      *ptr = block;
    } else {
      // restore, then return
      *ptr = builder.makeSequence(makeStackRestore(), ret);
    }
  }
  // add stack restores to the body
  if (func->body->type == Type::none) {
    block->list.push_back(func->body);
    block->list.push_back(makeStackRestore());
  } else if (func->body->type == Type::unreachable) {
    block->list.push_back(func->body);
    // no need to restore the old stack value, we're gone anyhow
  } else {
    // save the return value
    auto temp = builder.addVar(func, func->getResults());
    block->list.push_back(builder.makeLocalSet(temp, func->body));
    block->list.push_back(makeStackRestore());
    block->list.push_back(builder.makeLocalGet(temp, func->getResults()));
  }
  block->finalize();
  func->body = block;
}